

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

void Assimp::IFC::ConvertTransformOperator(IfcMatrix4 *out,IfcCartesianTransformationOperator *op)

{
  IfcCartesianPoint *in;
  IfcDirection *pIVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  IfcVector3 y;
  IfcVector3 loc;
  double local_148;
  double local_100;
  double local_f8;
  IfcVector3 local_e0;
  IfcVector3 local_c8 [3];
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  IfcVector3 local_50;
  IfcVector3 local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>((op->LocalOrigin).obj);
  ConvertCartesianPoint(&local_38,in);
  local_50.x = 1.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  local_e0.x = 0.0;
  local_e0.y = 1.0;
  local_e0.z = 0.0;
  local_c8[0].x = 0.0;
  local_c8[0].y = 0.0;
  local_c8[0].z = 1.0;
  if (op->field_0x38 == '\x01') {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                       (*(LazyObject **)&(op->super_IfcGeometricRepresentationItem).field_0x30);
    ConvertDirection(&local_50,pIVar1);
  }
  if ((op->Axis2).have == true) {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>((op->Axis2).ptr.obj);
    ConvertDirection(&local_e0,pIVar1);
  }
  lVar2 = __dynamic_cast((_func_int *)
                         ((long)&(op->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(op->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                         &Schema_2x3::IfcCartesianTransformationOperator3D::typeinfo,
                         0xffffffffffffffff);
  if ((lVar2 != 0) && (*(char *)(lVar2 + 0x80) == '\x01')) {
    pIVar1 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                       (*(LazyObject **)(lVar2 + 0x78));
    ConvertDirection(local_c8,pIVar1);
  }
  dVar13 = local_38.y;
  dVar8 = local_38.x;
  dVar11 = local_50.z;
  dVar22 = local_50.x;
  dVar10 = local_c8[0].z;
  dVar14 = local_c8[0].x;
  dVar6 = local_e0.z;
  dVar33 = local_e0.x;
  local_58 = local_38.z;
  out->a1 = local_50.x;
  local_70 = local_50.y;
  out->b1 = local_50.y;
  out->c1 = local_50.z;
  out->a2 = local_e0.x;
  local_68 = local_e0.y;
  out->b2 = local_e0.y;
  out->c2 = local_e0.z;
  out->a3 = local_c8[0].x;
  local_60 = local_c8[0].y;
  out->b3 = local_c8[0].y;
  out->c3 = local_c8[0].z;
  lVar2 = __dynamic_cast((_func_int *)
                         ((long)&(op->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper +
                         (long)(op->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                         &Schema_2x3::IfcCartesianTransformationOperator3DnonUniform::typeinfo,
                         0xffffffffffffffff);
  if (lVar2 == 0) {
    if ((op->Scale).have == false) {
      uVar3 = 0;
      uVar4 = 0x3ff00000;
    }
    else {
      dVar15 = (op->Scale).ptr;
      uVar3 = SUB84(dVar15,0);
      uVar4 = (undefined4)((ulong)dVar15 >> 0x20);
    }
    local_148 = (double)CONCAT44(uVar4,uVar3);
    local_f8 = (double)CONCAT44(uVar4,uVar3);
    local_100 = (double)CONCAT44(uVar4,uVar3);
  }
  else {
    uVar3 = 0;
    uVar4 = 0x3ff00000;
    local_100 = 1.0;
    if (*(char *)(lVar2 + 0x60) == '\x01') {
      if ((op->Scale).have == false) {
        __assert_fail("have",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/./code/Step/STEPFile.h"
                      ,0x240,"const T &Assimp::STEP::Maybe<double>::Get() const [T = double]");
      }
      local_100 = (op->Scale).ptr;
    }
    local_f8 = 1.0;
    if (*(char *)(lVar2 + 0xa0) == '\x01') {
      local_f8 = *(double *)(lVar2 + 0x98);
    }
    if (*(char *)(lVar2 + 0xb0) == '\x01') {
      uVar3 = (undefined4)*(undefined8 *)(lVar2 + 0xa8);
      uVar4 = (undefined4)((ulong)*(undefined8 *)(lVar2 + 0xa8) >> 0x20);
    }
    local_148 = (double)CONCAT44(uVar4,uVar3);
  }
  dVar12 = dVar11 * 0.0;
  dVar15 = out->d1;
  dVar5 = dVar15 * dVar8 + dVar22 + local_70 * 0.0 + dVar12;
  dVar38 = dVar6 * 0.0;
  dVar16 = out->d2;
  dVar25 = dVar16 * dVar8 + dVar33 + local_68 * 0.0 + dVar38;
  dVar17 = dVar10 * 0.0;
  dVar18 = out->d3;
  dVar24 = dVar18 * dVar8 + dVar14 + local_60 * 0.0 + dVar17;
  dVar7 = out->b4 * 0.0;
  dVar19 = out->c4 * 0.0;
  dVar9 = out->d4;
  dVar20 = dVar8 * dVar9 + out->a4 + dVar7 + dVar19;
  dVar22 = dVar22 * 0.0;
  dVar21 = dVar15 * dVar13 + local_70 + dVar22 + dVar12;
  dVar33 = dVar33 * 0.0;
  dVar29 = dVar16 * dVar13 + local_68 + dVar33 + dVar38;
  dVar14 = dVar14 * 0.0;
  dVar27 = dVar18 * dVar13 + local_60 + dVar14 + dVar17;
  dVar8 = out->a4 * 0.0;
  dVar13 = dVar13 * dVar9 + out->b4 + dVar8 + dVar19;
  dVar22 = dVar22 + local_70 * 0.0;
  dVar23 = dVar22 + dVar12 + dVar15;
  dVar12 = dVar15 * local_58 + dVar11 + dVar22;
  dVar33 = dVar33 + local_68 * 0.0;
  dVar34 = dVar33 + dVar38 + dVar16;
  dVar39 = dVar16 * local_58 + dVar6 + dVar33;
  dVar14 = dVar14 + local_60 * 0.0;
  dVar15 = dVar14 + dVar17 + dVar18;
  dVar35 = dVar18 * local_58 + dVar10 + dVar14;
  dVar8 = dVar8 + dVar7;
  dVar16 = local_58 * dVar9 + out->c4 + dVar8;
  dVar9 = dVar8 + dVar19 + dVar9;
  dVar26 = dVar25 * 0.0;
  dVar10 = dVar5 * 0.0;
  dVar22 = dVar10 + dVar26;
  dVar38 = dVar24 * 0.0;
  dVar14 = dVar20 * 0.0;
  dVar30 = dVar29 * 0.0;
  dVar33 = dVar21 * 0.0;
  dVar6 = dVar33 + dVar30;
  dVar28 = dVar27 * 0.0;
  dVar11 = dVar13 * 0.0;
  dVar40 = dVar39 * 0.0;
  dVar18 = dVar12 * 0.0;
  dVar19 = dVar18 + dVar40;
  dVar36 = dVar35 * 0.0;
  dVar31 = dVar16 * 0.0;
  dVar32 = dVar34 * 0.0;
  dVar7 = dVar23 * 0.0;
  dVar17 = dVar7 + dVar32;
  dVar37 = dVar15 * 0.0;
  dVar8 = dVar9 * 0.0;
  out->a1 = local_100 * dVar5 + dVar26 + dVar38 + dVar14;
  out->a2 = local_f8 * dVar25 + dVar10 + dVar38 + dVar14;
  out->a3 = local_148 * dVar24 + dVar22 + dVar14;
  out->a4 = dVar22 + dVar38 + dVar20;
  out->b1 = local_100 * dVar21 + dVar30 + dVar28 + dVar11;
  out->b2 = local_f8 * dVar29 + dVar33 + dVar28 + dVar11;
  out->b3 = local_148 * dVar27 + dVar6 + dVar11;
  out->b4 = dVar6 + dVar28 + dVar13;
  out->c1 = local_100 * dVar12 + dVar40 + dVar36 + dVar31;
  out->c2 = local_f8 * dVar39 + dVar18 + dVar36 + dVar31;
  out->c3 = local_148 * dVar35 + dVar19 + dVar31;
  out->c4 = dVar19 + dVar36 + dVar16;
  out->d1 = local_100 * dVar23 + dVar32 + dVar37 + dVar8;
  out->d2 = local_f8 * dVar34 + dVar7 + dVar37 + dVar8;
  out->d3 = local_148 * dVar15 + dVar17 + dVar8;
  out->d4 = dVar17 + dVar37 + dVar9;
  return;
}

Assistant:

void ConvertTransformOperator(IfcMatrix4& out, const Schema_2x3::IfcCartesianTransformationOperator& op)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,op.LocalOrigin);

    IfcVector3 x(1.f,0.f,0.f),y(0.f,1.f,0.f),z(0.f,0.f,1.f);
    if (op.Axis1) {
        ConvertDirection(x,*op.Axis1.Get());
    }
    if (op.Axis2) {
        ConvertDirection(y,*op.Axis2.Get());
    }
    if (const Schema_2x3::IfcCartesianTransformationOperator3D* op2 = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3D>()) {
        if(op2->Axis3) {
            ConvertDirection(z,*op2->Axis3.Get());
        }
    }

    IfcMatrix4 locm;
    IfcMatrix4::Translation(loc,locm);
    AssignMatrixAxes(out,x,y,z);


    IfcVector3 vscale;
    if (const Schema_2x3::IfcCartesianTransformationOperator3DnonUniform* nuni = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>()) {
        vscale.x = nuni->Scale?op.Scale.Get():1.f;
        vscale.y = nuni->Scale2?nuni->Scale2.Get():1.f;
        vscale.z = nuni->Scale3?nuni->Scale3.Get():1.f;
    }
    else {
        const IfcFloat sc = op.Scale?op.Scale.Get():1.f;
        vscale = IfcVector3(sc,sc,sc);
    }

    IfcMatrix4 s;
    IfcMatrix4::Scaling(vscale,s);

    out = locm * out * s;
}